

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktTessellationMiscDrawTests.cpp
# Opt level: O0

TestCaseGroup * vkt::tessellation::createMiscDrawTests(TestContext *testCtx)

{
  undefined4 uVar1;
  undefined4 uVar2;
  TestCaseGroup *pTVar3;
  char *pcVar4;
  string local_348;
  CaseDefinition local_328;
  allocator<char> local_2f9;
  string local_2f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2b8;
  undefined1 local_298 [8];
  string caseName_2;
  SpacingMode spacingMode_2;
  int spacingModeNdx_2;
  CaseDefinition local_250;
  allocator<char> local_221;
  string local_220;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_200;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1a0;
  undefined1 local_180 [8];
  string caseName_1;
  SpacingMode spacingMode_1;
  TessPrimitiveType primitiveType_1;
  int spacingModeNdx_1;
  int primitiveTypeNdx_1;
  CaseDefinition local_130;
  allocator<char> local_101;
  string local_100;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_80;
  undefined1 local_60 [8];
  string caseName;
  SpacingMode spacingMode;
  TessPrimitiveType primitiveType;
  int spacingModeNdx;
  int primitiveTypeNdx;
  undefined1 local_20 [8];
  MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_> group;
  TestContext *testCtx_local;
  
  group.super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.m_data._8_8_ =
       testCtx;
  pTVar3 = (TestCaseGroup *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            (pTVar3,(TestContext *)
                    group.
                    super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.
                    m_data._8_8_,"misc_draw","Miscellaneous draw-result-verifying cases");
  de::DefaultDeleter<tcu::TestCaseGroup>::DefaultDeleter
            ((DefaultDeleter<tcu::TestCaseGroup> *)((long)&spacingModeNdx + 3));
  de::details::MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>::MovePtr
            ((MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_> *)local_20,pTVar3
            );
  for (primitiveType = TESSPRIMITIVETYPE_TRIANGLES; (int)primitiveType < 2;
      primitiveType = primitiveType + TESSPRIMITIVETYPE_QUADS) {
    for (spacingMode = SPACINGMODE_EQUAL; (int)spacingMode < 3;
        spacingMode = spacingMode + SPACINGMODE_FRACTIONAL_ODD) {
      caseName.field_2._12_4_ = createMiscDrawTests::primitivesNoIsolines[(int)primitiveType];
      caseName.field_2._8_4_ = spacingMode;
      std::__cxx11::string::string((string *)&local_e0);
      std::operator+(&local_c0,&local_e0,"fill_cover_");
      pcVar4 = getTessPrimitiveTypeShaderName(caseName.field_2._12_4_);
      std::operator+(&local_a0,&local_c0,pcVar4);
      std::operator+(&local_80,&local_a0,"_");
      pcVar4 = getSpacingModeShaderName(caseName.field_2._8_4_);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_60,
                     &local_80,pcVar4);
      std::__cxx11::string::~string((string *)&local_80);
      std::__cxx11::string::~string((string *)&local_a0);
      std::__cxx11::string::~string((string *)&local_c0);
      std::__cxx11::string::~string((string *)&local_e0);
      pTVar3 = de::details::UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>
               ::get((UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_> *)
                     local_20);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_100,
                 "Check that there are no obvious gaps in the triangle-filled area of a tessellated shape"
                 ,&local_101);
      uVar2 = caseName.field_2._12_4_;
      uVar1 = caseName.field_2._8_4_;
      anon_unknown_2::getReferenceImagePathPrefix((string *)&spacingModeNdx_1,(string *)local_60);
      anon_unknown_2::makeCaseDefinition(&local_130,uVar2,uVar1,(string *)&spacingModeNdx_1);
      addFunctionCaseWithPrograms<vkt::tessellation::(anonymous_namespace)::CaseDefinition>
                (pTVar3,(string *)local_60,&local_100,anon_unknown_2::initProgramsFillCoverCase,
                 anon_unknown_2::runTest,&local_130);
      anon_unknown_2::CaseDefinition::~CaseDefinition(&local_130);
      std::__cxx11::string::~string((string *)&spacingModeNdx_1);
      std::__cxx11::string::~string((string *)&local_100);
      std::allocator<char>::~allocator(&local_101);
      std::__cxx11::string::~string((string *)local_60);
    }
  }
  for (primitiveType_1 = TESSPRIMITIVETYPE_TRIANGLES; (int)primitiveType_1 < 2;
      primitiveType_1 = primitiveType_1 + TESSPRIMITIVETYPE_QUADS) {
    for (spacingMode_1 = SPACINGMODE_EQUAL; (int)spacingMode_1 < 3;
        spacingMode_1 = spacingMode_1 + SPACINGMODE_FRACTIONAL_ODD) {
      caseName_1.field_2._12_4_ = createMiscDrawTests::primitivesNoIsolines[(int)primitiveType_1];
      caseName_1.field_2._8_4_ = spacingMode_1;
      std::__cxx11::string::string((string *)&local_200);
      std::operator+(&local_1e0,&local_200,"fill_overlap_");
      pcVar4 = getTessPrimitiveTypeShaderName(caseName_1.field_2._12_4_);
      std::operator+(&local_1c0,&local_1e0,pcVar4);
      std::operator+(&local_1a0,&local_1c0,"_");
      pcVar4 = getSpacingModeShaderName(caseName_1.field_2._8_4_);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_180,
                     &local_1a0,pcVar4);
      std::__cxx11::string::~string((string *)&local_1a0);
      std::__cxx11::string::~string((string *)&local_1c0);
      std::__cxx11::string::~string((string *)&local_1e0);
      std::__cxx11::string::~string((string *)&local_200);
      pTVar3 = de::details::UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>
               ::get((UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_> *)
                     local_20);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_220,
                 "Check that there are no obvious triangle overlaps in the triangle-filled area of a tessellated shape"
                 ,&local_221);
      uVar2 = caseName_1.field_2._12_4_;
      uVar1 = caseName_1.field_2._8_4_;
      anon_unknown_2::getReferenceImagePathPrefix((string *)&spacingMode_2,(string *)local_180);
      anon_unknown_2::makeCaseDefinition(&local_250,uVar2,uVar1,(string *)&spacingMode_2);
      addFunctionCaseWithPrograms<vkt::tessellation::(anonymous_namespace)::CaseDefinition>
                (pTVar3,(string *)local_180,&local_220,
                 anon_unknown_2::initProgramsFillNonOverlapCase,anon_unknown_2::runTest,&local_250);
      anon_unknown_2::CaseDefinition::~CaseDefinition(&local_250);
      std::__cxx11::string::~string((string *)&spacingMode_2);
      std::__cxx11::string::~string((string *)&local_220);
      std::allocator<char>::~allocator(&local_221);
      std::__cxx11::string::~string((string *)local_180);
    }
  }
  for (caseName_2.field_2._12_4_ = 0; (int)caseName_2.field_2._12_4_ < 3;
      caseName_2.field_2._12_4_ = caseName_2.field_2._12_4_ + 1) {
    caseName_2.field_2._8_4_ = caseName_2.field_2._12_4_;
    std::__cxx11::string::string((string *)&local_2d8);
    std::operator+(&local_2b8,&local_2d8,"isolines_");
    pcVar4 = getSpacingModeShaderName(caseName_2.field_2._8_4_);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_298,
                   &local_2b8,pcVar4);
    std::__cxx11::string::~string((string *)&local_2b8);
    std::__cxx11::string::~string((string *)&local_2d8);
    pTVar3 = de::details::UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>::
             get((UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_> *)local_20
                );
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_2f8,"Basic isolines render test",&local_2f9);
    uVar1 = caseName_2.field_2._8_4_;
    anon_unknown_2::getReferenceImagePathPrefix(&local_348,(string *)local_298);
    anon_unknown_2::makeCaseDefinition(&local_328,TESSPRIMITIVETYPE_ISOLINES,uVar1,&local_348);
    addFunctionCaseWithPrograms<vkt::tessellation::(anonymous_namespace)::CaseDefinition>
              (pTVar3,(string *)local_298,&local_2f8,anon_unknown_2::initProgramsIsolinesCase,
               anon_unknown_2::runTest,&local_328);
    anon_unknown_2::CaseDefinition::~CaseDefinition(&local_328);
    std::__cxx11::string::~string((string *)&local_348);
    std::__cxx11::string::~string((string *)&local_2f8);
    std::allocator<char>::~allocator(&local_2f9);
    std::__cxx11::string::~string((string *)local_298);
  }
  pTVar3 = de::details::MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>::
           release((MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_> *)local_20)
  ;
  de::details::MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>::~MovePtr
            ((MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_> *)local_20);
  return pTVar3;
}

Assistant:

tcu::TestCaseGroup* createMiscDrawTests (tcu::TestContext& testCtx)
{
	de::MovePtr<tcu::TestCaseGroup> group (new tcu::TestCaseGroup(testCtx, "misc_draw", "Miscellaneous draw-result-verifying cases"));

	static const TessPrimitiveType primitivesNoIsolines[] =
	{
		TESSPRIMITIVETYPE_TRIANGLES,
		TESSPRIMITIVETYPE_QUADS,
	};

	// Triangle fill case
	for (int primitiveTypeNdx = 0; primitiveTypeNdx < DE_LENGTH_OF_ARRAY(primitivesNoIsolines); ++primitiveTypeNdx)
	for (int spacingModeNdx = 0; spacingModeNdx < SPACINGMODE_LAST; ++spacingModeNdx)
	{
		const TessPrimitiveType primitiveType = primitivesNoIsolines[primitiveTypeNdx];
		const SpacingMode		spacingMode	  = static_cast<SpacingMode>(spacingModeNdx);
		const std::string		caseName	  = std::string() + "fill_cover_" + getTessPrimitiveTypeShaderName(primitiveType) + "_" + getSpacingModeShaderName(spacingMode);

		addFunctionCaseWithPrograms(group.get(), caseName, "Check that there are no obvious gaps in the triangle-filled area of a tessellated shape",
									initProgramsFillCoverCase, runTest, makeCaseDefinition(primitiveType, spacingMode, getReferenceImagePathPrefix(caseName)));
	}

	// Triangle non-overlap case
	for (int primitiveTypeNdx = 0; primitiveTypeNdx < DE_LENGTH_OF_ARRAY(primitivesNoIsolines); ++primitiveTypeNdx)
	for (int spacingModeNdx = 0; spacingModeNdx < SPACINGMODE_LAST; ++spacingModeNdx)
	{
		const TessPrimitiveType primitiveType = primitivesNoIsolines[primitiveTypeNdx];
		const SpacingMode		spacingMode	  = static_cast<SpacingMode>(spacingModeNdx);
		const std::string		caseName	  = std::string() + "fill_overlap_" + getTessPrimitiveTypeShaderName(primitiveType) + "_" + getSpacingModeShaderName(spacingMode);

		addFunctionCaseWithPrograms(group.get(), caseName, "Check that there are no obvious triangle overlaps in the triangle-filled area of a tessellated shape",
									initProgramsFillNonOverlapCase, runTest, makeCaseDefinition(primitiveType, spacingMode, getReferenceImagePathPrefix(caseName)));
	}

	// Isolines
	for (int spacingModeNdx = 0; spacingModeNdx < SPACINGMODE_LAST; ++spacingModeNdx)
	{
		const SpacingMode spacingMode = static_cast<SpacingMode>(spacingModeNdx);
		const std::string caseName    = std::string() + "isolines_" + getSpacingModeShaderName(spacingMode);

		addFunctionCaseWithPrograms(group.get(), caseName, "Basic isolines render test",
									initProgramsIsolinesCase, runTest, makeCaseDefinition(TESSPRIMITIVETYPE_ISOLINES, spacingMode, getReferenceImagePathPrefix(caseName)));
	}

	return group.release();
}